

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O1

void cycle(uint64_t error,int start,int depth,uint64_t codeword)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  UT_hash_handle *pUVar7;
  UT_hash_table *pUVar8;
  UT_hash_bucket *pUVar9;
  UT_hash_handle *pUVar10;
  UT_hash_handle *pUVar11;
  syndrome_struct *psVar12;
  ulong uVar13;
  syndrome_struct *psVar14;
  UT_hash_table *pUVar15;
  UT_hash_bucket *pUVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  size_t __size;
  uint uVar23;
  ulong uVar24;
  
  if (start < 0x3a) {
    uVar24 = (ulong)(uint)start;
    do {
      uVar22 = error | 1L << (uVar24 & 0x3f);
      if (depth + -1 == 0) {
        uVar13 = uVar22 ^ 0xcc7b7268ff614e1b;
        uVar23 = (uint)(uVar13 >> 0x20);
        uVar3 = sw_check_table4[uVar23 & 0xff];
        uVar4 = sw_check_table5[uVar23 >> 8 & 0xff];
        uVar5 = sw_check_table6[(ushort)(uVar13 >> 0x30) & 0xff];
        uVar6 = sw_check_table7[uVar13 >> 0x38];
        psVar14 = (syndrome_struct *)malloc(0x48);
        psVar14->syndrome = uVar13 & 0xffffffff ^ uVar3 ^ uVar4 ^ uVar5 ^ uVar6;
        psVar14->error = uVar22;
        pUVar1 = &psVar14->hh;
        (psVar14->hh).next = (void *)0x0;
        (psVar14->hh).key = psVar14;
        (psVar14->hh).keylen = 8;
        if (syndrome_map == (syndrome_struct *)0x0) {
          syndrome_map = psVar14;
          (psVar14->hh).prev = (void *)0x0;
          pUVar15 = (UT_hash_table *)malloc(0x40);
          (psVar14->hh).tbl = pUVar15;
          if (pUVar15 == (UT_hash_table *)0x0) goto LAB_0010571c;
          *(undefined8 *)&pUVar15->num_items = 0;
          pUVar15->tail = (UT_hash_handle *)0x0;
          pUVar15->buckets = (UT_hash_bucket *)0x0;
          pUVar15->num_buckets = 0;
          pUVar15->log2_num_buckets = 0;
          pUVar15->hho = 0;
          pUVar15->ideal_chain_maxlen = 0;
          pUVar15->nonideal_items = 0;
          pUVar15->ineff_expands = 0;
          pUVar15->noexpand = 0;
          *(undefined8 *)&pUVar15->signature = 0;
          pUVar15->tail = pUVar1;
          pUVar15->num_buckets = 0x20;
          pUVar15->log2_num_buckets = 5;
          pUVar15->hho = 0x10;
          pUVar16 = (UT_hash_bucket *)malloc(0x200);
          pUVar15->buckets = pUVar16;
          if (pUVar16 == (UT_hash_bucket *)0x0) goto LAB_0010571c;
          memset(pUVar16,0,0x200);
          pUVar15->signature = 0xa0111fe1;
        }
        else {
          pUVar15 = (syndrome_map->hh).tbl;
          pUVar7 = pUVar15->tail;
          pUVar7->next = psVar14;
          (psVar14->hh).prev = (void *)((long)pUVar7 - pUVar15->hho);
          pUVar15->tail = pUVar1;
        }
        psVar12 = syndrome_map;
        pUVar15 = (syndrome_map->hh).tbl;
        pUVar15->num_items = pUVar15->num_items + 1;
        (psVar14->hh).tbl = pUVar15;
        iVar17 = *(int *)((long)&psVar14->syndrome + 4) + -0x61c88647;
        uVar20 = (uint)(byte)psVar14->syndrome +
                 ((uint)*(byte *)((long)&psVar14->syndrome + 3) * 0x1000000 - iVar17) +
                 (uint)*(byte *)((long)&psVar14->syndrome + 1) * 0x100 +
                 (uint)*(byte *)((long)&psVar14->syndrome + 2) * 0x10000 + 0x9f49bac2 ^ 0x7f76d;
        uVar18 = uVar20 << 8 ^ (iVar17 - uVar20) + 0x1124109;
        uVar23 = uVar18 >> 0xd ^ (-0x1124109 - uVar20) - uVar18;
        uVar20 = uVar23 >> 0xc ^ (uVar20 - uVar18) - uVar23;
        uVar21 = uVar20 << 0x10 ^ (uVar18 - uVar23) - uVar20;
        uVar18 = uVar21 >> 5 ^ (uVar23 - uVar20) - uVar21;
        uVar23 = uVar18 >> 3 ^ (uVar20 - uVar21) - uVar18;
        uVar20 = uVar23 << 10 ^ (uVar21 - uVar18) - uVar23;
        uVar23 = uVar20 >> 0xf ^ uVar18 - (uVar23 + uVar20);
        (psVar14->hh).hashv = uVar23;
        pUVar8 = (psVar12->hh).tbl;
        uVar23 = pUVar8->num_buckets - 1 & uVar23;
        pUVar16 = pUVar8->buckets;
        pUVar16[uVar23].count = pUVar16[uVar23].count + 1;
        pUVar7 = pUVar16[uVar23].hh_head;
        (psVar14->hh).hh_next = pUVar7;
        (psVar14->hh).hh_prev = (UT_hash_handle *)0x0;
        if (pUVar7 != (UT_hash_handle *)0x0) {
          pUVar7->hh_prev = pUVar1;
        }
        pUVar16 = pUVar16 + uVar23;
        pUVar16->hh_head = pUVar1;
        uVar23 = pUVar16->expand_mult * 10 + 10;
        codeword = (uint64_t)uVar23;
        if ((uVar23 <= pUVar16->count) && (pUVar15->noexpand != 1)) {
          __size = (ulong)(pUVar15->num_buckets * 2) << 4;
          pUVar16 = (UT_hash_bucket *)malloc(__size);
          if (pUVar16 == (UT_hash_bucket *)0x0) {
LAB_0010571c:
            exit(-1);
          }
          memset(pUVar16,0,__size);
          uVar23 = pUVar15->num_buckets;
          uVar20 = uVar23 * 2 - 1;
          uVar18 = ((pUVar15->num_items >> ((char)pUVar15->log2_num_buckets + 1U & 0x1f)) + 1) -
                   (uint)((uVar20 & pUVar15->num_items) == 0);
          pUVar15->ideal_chain_maxlen = uVar18;
          pUVar15->nonideal_items = 0;
          if ((ulong)uVar23 != 0) {
            pUVar9 = pUVar15->buckets;
            uVar22 = 0;
            do {
              pUVar7 = pUVar9[uVar22].hh_head;
              while (pUVar7 != (UT_hash_handle *)0x0) {
                pUVar10 = pUVar7->hh_next;
                uVar19 = pUVar7->hashv & uVar20;
                pUVar2 = pUVar16 + uVar19;
                uVar21 = pUVar16[uVar19].count + 1;
                pUVar16[uVar19].count = uVar21;
                if (uVar18 < uVar21) {
                  pUVar15->nonideal_items = pUVar15->nonideal_items + 1;
                  pUVar2->expand_mult = uVar21 / uVar18;
                }
                pUVar7->hh_prev = (UT_hash_handle *)0x0;
                pUVar11 = pUVar2->hh_head;
                pUVar7->hh_next = pUVar11;
                if (pUVar11 != (UT_hash_handle *)0x0) {
                  pUVar11->hh_prev = pUVar7;
                }
                pUVar2->hh_head = pUVar7;
                pUVar7 = pUVar10;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar23);
          }
          free(pUVar15->buckets);
          pUVar15 = pUVar1->tbl;
          pUVar15->num_buckets = pUVar15->num_buckets << 1;
          pUVar15->log2_num_buckets = pUVar15->log2_num_buckets + 1;
          pUVar15->buckets = pUVar16;
          codeword = 0;
          if (pUVar15->num_items >> 1 < pUVar15->nonideal_items) {
            codeword = (uint64_t)(pUVar15->ineff_expands + 1);
          }
          pUVar15->ineff_expands = (uint)codeword;
          if (1 < (uint)codeword) {
            pUVar15->noexpand = 1;
          }
        }
      }
      else {
        cycle(uVar22,(int)uVar24 + 1,depth + -1,codeword);
      }
      uVar23 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar23;
    } while (uVar23 != 0x3a);
  }
  return;
}

Assistant:

static void cycle(uint64_t error, int start, int depth, uint64_t codeword)
{
	uint64_t new_error, syndrome, base;
	int i;
	base = 1;
	depth -= 1;
	for (i = start; i < 58; i++)
	{
		new_error = (base << i);
		new_error |= error;
		if (depth)
			cycle(new_error, i + 1, depth, codeword);
		else {
			syndrome = gen_syndrome(codeword ^ new_error);
			add_syndrome(syndrome, new_error);
		}
	}
}